

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.hpp
# Opt level: O1

cx_string<7UL>
mserialize::detail::
BuiltinTag<std::tuple<int,_bool,_char,_std::vector<int,_std::allocator<int>_>_>,_void>::tag_string
          (void)

{
  cx_string<2UL> cVar1;
  cx_string<7UL> cVar2;
  cx_string<1UL> local_3e;
  cx_string<2UL> local_3c;
  cx_string<1UL> local_38;
  cx_string<1UL> local_36;
  cx_string<1UL> local_34;
  cx_string<1UL> local_32;
  
  local_32._data[0] = '(';
  local_32._data[1] = '\0';
  local_34._data[0] = 'i';
  local_34._data[1] = '\0';
  local_36._data[0] = 'y';
  local_36._data[1] = '\0';
  local_38._data[0] = 'c';
  local_38._data[1] = '\0';
  local_3c._data[0] = '[';
  local_3c._data[1] = '\0';
  local_3e._data[0] = 'i';
  local_3e._data[1] = '\0';
  cVar1 = cx_strcat<1ul,1ul>((cx_string<1UL> *)&local_3c,&local_3e);
  local_3c._data._0_2_ = cVar1._data._0_2_;
  local_3c._data[2] = cVar1._data[2];
  local_3e._data[0] = ')';
  local_3e._data[1] = '\0';
  cVar2 = cx_strcat<1ul,1ul,1ul,1ul,2ul,1ul>
                    (&local_32,&local_34,&local_36,&local_38,&local_3c,&local_3e);
  return (cx_string<7UL>)cVar2._data;
}

Assistant:

static constexpr auto tag_string()
  {
    return cx_strcat(
      make_cx_string("("),
      Tag<E>::type::tag_string()...,
      make_cx_string(")")
    );
  }